

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinLoader.cpp
# Opt level: O0

void __thiscall
Assimp::AssbinImporter::ReadBinaryAnim(AssbinImporter *this,IOStream *stream,aiAnimation *anim)

{
  undefined1 auVar1 [16];
  uint uVar2;
  DeadlyImportError *this_00;
  ulong uVar3;
  aiNodeAnim **ppaVar4;
  aiNodeAnim *this_01;
  double dVar5;
  uint local_460;
  undefined1 local_45c [4];
  uint a;
  undefined1 local_55;
  allocator local_41;
  string local_40;
  aiAnimation *local_20;
  aiAnimation *anim_local;
  IOStream *stream_local;
  AssbinImporter *this_local;
  
  local_20 = anim;
  anim_local = (aiAnimation *)stream;
  stream_local = (IOStream *)this;
  uVar2 = Read<unsigned_int>(stream);
  if (uVar2 == 0x123b) {
    Read<unsigned_int>((IOStream *)anim_local);
    Read<aiString>((aiString *)local_45c,(IOStream *)anim_local);
    aiString::operator=(&local_20->mName,(aiString *)local_45c);
    dVar5 = Read<double>((IOStream *)anim_local);
    local_20->mDuration = dVar5;
    dVar5 = Read<double>((IOStream *)anim_local);
    local_20->mTicksPerSecond = dVar5;
    uVar2 = Read<unsigned_int>((IOStream *)anim_local);
    local_20->mNumChannels = uVar2;
    if (local_20->mNumChannels != 0) {
      auVar1 = ZEXT416(local_20->mNumChannels) * ZEXT816(8);
      uVar3 = auVar1._0_8_;
      if (auVar1._8_8_ != 0) {
        uVar3 = 0xffffffffffffffff;
      }
      ppaVar4 = (aiNodeAnim **)operator_new__(uVar3);
      local_20->mChannels = ppaVar4;
      for (local_460 = 0; local_460 < local_20->mNumChannels; local_460 = local_460 + 1) {
        this_01 = (aiNodeAnim *)operator_new(0x438);
        aiNodeAnim::aiNodeAnim(this_01);
        local_20->mChannels[local_460] = this_01;
        ReadBinaryNodeAnim(this,(IOStream *)anim_local,local_20->mChannels[local_460]);
      }
    }
    return;
  }
  local_55 = 1;
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"Magic chunk identifiers are wrong!",&local_41);
  DeadlyImportError::DeadlyImportError(this_00,&local_40);
  local_55 = 0;
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void AssbinImporter::ReadBinaryAnim( IOStream * stream, aiAnimation* anim ) {
    if(Read<uint32_t>(stream) != ASSBIN_CHUNK_AIANIMATION)
        throw DeadlyImportError("Magic chunk identifiers are wrong!");
    /*uint32_t size =*/ Read<uint32_t>(stream);

    anim->mName = Read<aiString> (stream);
    anim->mDuration = Read<double> (stream);
    anim->mTicksPerSecond = Read<double> (stream);
    anim->mNumChannels = Read<unsigned int>(stream);

    if (anim->mNumChannels) {
        anim->mChannels = new aiNodeAnim*[ anim->mNumChannels ];
        for (unsigned int a = 0; a < anim->mNumChannels;++a) {
            anim->mChannels[a] = new aiNodeAnim();
            ReadBinaryNodeAnim(stream,anim->mChannels[a]);
        }
    }
}